

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

int dotypeinv(void)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  obj *poVar7;
  long lVar8;
  long lVar9;
  char cVar10;
  char *pcVar11;
  obj **ppoVar12;
  bool bVar13;
  object_pick *dummy;
  int local_d0;
  int local_cc;
  long local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  obj *local_b0;
  int pick_list [30];
  
  if (u.ushops[0] == '\0') {
    bVar13 = false;
  }
  else {
    iVar3 = doinvbill(0);
    bVar13 = iVar3 != 0;
  }
  poVar5 = invent;
  if (invent == (obj *)0x0 && bVar13 == false) {
    pcVar11 = "You aren\'t carrying anything.";
  }
  else {
    iVar3 = count_unpaid(invent);
    iVar4 = query_category("What type of object do you want an inventory of?",poVar5,
                           (uint)bVar13 << 5 | 2,pick_list,1);
    poVar5 = invent;
    if (iVar4 == 0) {
      return 0;
    }
    this_type = (int)(char)pick_list[0];
    if (pick_list[0] << 0x18 == 0x75000000) {
      if (iVar3 != 0) {
        local_bc = count_unpaid(invent);
        if (local_bc != 1) {
          init_menulist((menulist *)&dummy);
          pcVar11 = flags.inv_order;
          local_c8 = 0;
          iVar3 = 0;
LAB_001a9d9d:
          local_b8 = 0;
          ppoVar12 = &invent;
LAB_001a9dab:
          do {
            ppoVar12 = &((obj *)ppoVar12)->nobj->nobj;
            if ((obj *)ppoVar12 == (obj *)0x0) goto LAB_001a9f41;
            if ((((obj *)ppoVar12)->field_0x4a & 4) != 0) {
              if (flags.sortpack == '\0') {
                cVar10 = ((obj *)ppoVar12)->invlet;
                local_b4 = iVar3;
              }
              else {
                if (((obj *)ppoVar12)->oclass != *pcVar11) goto LAB_001a9dab;
                cVar10 = ((obj *)ppoVar12)->invlet;
                local_b4 = iVar3;
                if (local_b8 == 0) {
                  lVar8 = (long)local_d0;
                  if (local_d0 <= local_cc) {
                    local_d0 = local_d0 * 2;
                    dummy = (object_pick *)realloc(dummy,lVar8 * 0x218);
                  }
                  puVar1 = (undefined8 *)((long)dummy + (long)local_cc * 0x10c);
                  *puVar1 = 0;
                  *(undefined2 *)(puVar1 + 0x21) = 0;
                  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
                  pcVar6 = let_to_name(*pcVar11,'\x01');
                  strcpy((char *)(puVar1 + 1),pcVar6);
                  local_cc = local_cc + 1;
                  local_b8 = 1;
                }
              }
              lVar8 = unpaid_cost((obj *)ppoVar12);
              uVar2 = *(uint *)&((obj *)ppoVar12)->field_0x4a;
              *(uint *)&((obj *)ppoVar12)->field_0x4a = uVar2 & 0xfffffffb;
              lVar9 = (long)local_d0;
              if (local_d0 <= local_cc) {
                local_d0 = local_d0 * 2;
                dummy = (object_pick *)realloc(dummy,lVar9 * 0x218);
              }
              local_c8 = local_c8 + lVar8;
              puVar1 = (undefined8 *)((long)dummy + (long)local_cc * 0x10c);
              *puVar1 = 0;
              *(undefined2 *)(puVar1 + 0x21) = 0;
              *(undefined1 *)((long)puVar1 + 0x10a) = 0;
              pcVar6 = distant_name((obj *)ppoVar12,doname);
              xprname((obj *)ppoVar12,pcVar6,cVar10,'\x01',lVar8,0);
              strcpy((char *)(puVar1 + 1),xprname::li);
              local_cc = local_cc + 1;
              *(uint *)&((obj *)ppoVar12)->field_0x4a =
                   *(uint *)&((obj *)ppoVar12)->field_0x4a & 0xfffffffb | uVar2 & 4;
              iVar3 = local_b4 + 1;
            }
          } while( true );
        }
        local_b0 = (obj *)0x0;
        poVar5 = find_unpaid(poVar5,&local_b0);
        ppoVar12 = &invent;
        do {
          ppoVar12 = &((obj *)ppoVar12)->nobj->nobj;
          if ((obj *)ppoVar12 == (obj *)0x0) break;
        } while ((obj *)ppoVar12 != poVar5);
        pcVar11 = distant_name(poVar5,doname);
        if ((obj *)ppoVar12 == (obj *)0x0) {
          cVar10 = '>';
        }
        else {
          cVar10 = poVar5->invlet;
        }
        lVar8 = unpaid_cost(poVar5);
        xprname(poVar5,pcVar11,cVar10,'\x01',lVar8,0);
        pline("%s",xprname::li);
        return 0;
      }
      pcVar11 = "You are not carrying any unpaid objects.";
    }
    else {
      if (pick_list[0] << 0x18 != 0x78000000) {
        check_tutorial_oclass(this_type);
        iVar3 = query_objlist((char *)0x0,invent,0xc,&dummy,-1,this_type_only);
        if (iVar3 < 1) {
          return 0;
        }
        goto LAB_001aa1da;
      }
      if (bVar13 != false) {
        doinvbill(1);
        return 0;
      }
      pcVar11 = "No used-up objects on your shopping bill.";
    }
  }
  pline(pcVar11);
  return 0;
LAB_001a9f41:
  if (flags.sortpack == '\0') {
    if (local_bc <= iVar3) goto LAB_001aa0e2;
    goto LAB_001a9fe0;
  }
  pcVar6 = pcVar11 + 1;
  pcVar11 = pcVar11 + 1;
  if (*pcVar6 == '\0') goto code_r0x001a9f59;
  goto LAB_001a9d9d;
code_r0x001a9f59:
  if (iVar3 < local_bc) {
    lVar8 = (long)local_d0;
    if (local_d0 <= local_cc) {
      local_d0 = local_d0 * 2;
      dummy = (object_pick *)realloc(dummy,lVar8 * 0x218);
    }
    puVar1 = (undefined8 *)((long)dummy + (long)local_cc * 0x10c);
    *puVar1 = 0;
    *(undefined2 *)(puVar1 + 0x21) = 0;
    *(undefined1 *)((long)puVar1 + 0x10a) = 0;
    pcVar11 = let_to_name('>','\x01');
    strcpy((char *)(puVar1 + 1),pcVar11);
    local_cc = local_cc + 1;
LAB_001a9fe0:
    ppoVar12 = &invent;
    while (ppoVar12 = &((obj *)ppoVar12)->nobj->nobj, (obj *)ppoVar12 != (obj *)0x0) {
      poVar5 = ((obj *)ppoVar12)->cobj;
      if (poVar5 != (obj *)0x0) {
        local_b0 = (obj *)0x0;
        while (poVar7 = find_unpaid(poVar5,&local_b0), poVar5 = local_b0, poVar7 != (obj *)0x0) {
          lVar8 = unpaid_cost(local_b0);
          uVar2 = *(uint *)&poVar5->field_0x4a;
          *(uint *)&poVar5->field_0x4a = uVar2 & 0xfffffffb;
          lVar9 = (long)local_d0;
          if (local_d0 <= local_cc) {
            local_d0 = local_d0 * 2;
            dummy = (object_pick *)realloc(dummy,lVar9 * 0x218);
          }
          local_c8 = local_c8 + lVar8;
          puVar1 = (undefined8 *)((long)dummy + (long)local_cc * 0x10c);
          *puVar1 = 0;
          *(undefined2 *)(puVar1 + 0x21) = 0;
          *(undefined1 *)((long)puVar1 + 0x10a) = 0;
          pcVar11 = distant_name(poVar5,doname);
          xprname(poVar5,pcVar11,'>','\x01',lVar8,0);
          strcpy((char *)(puVar1 + 1),xprname::li);
          local_cc = local_cc + 1;
          *(uint *)&poVar5->field_0x4a = *(uint *)&poVar5->field_0x4a & 0xfffffffb | uVar2 & 4;
          poVar5 = ((obj *)ppoVar12)->cobj;
        }
      }
    }
  }
LAB_001aa0e2:
  lVar8 = local_c8;
  lVar9 = (long)local_d0;
  if (local_d0 <= local_cc) {
    local_d0 = local_d0 * 2;
    dummy = (object_pick *)realloc(dummy,lVar9 * 0x218);
  }
  lVar9 = (long)local_cc * 0x10c;
  *(undefined2 *)((long)dummy + lVar9 + 0x108) = 0;
  *(undefined1 *)((long)dummy + lVar9 + 0x10a) = 0;
  *(undefined8 *)((long)dummy + lVar9) = 0;
  *(undefined1 *)((long)dummy + lVar9 + 8) = 0;
  local_cc = local_cc + 1;
  lVar9 = (long)local_d0;
  if (local_d0 <= local_cc) {
    local_d0 = local_d0 * 2;
    dummy = (object_pick *)realloc(dummy,lVar9 * 0x218);
  }
  puVar1 = (undefined8 *)((long)dummy + (long)local_cc * 0x10c);
  *puVar1 = 0;
  *(undefined2 *)(puVar1 + 0x21) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  xprname((obj *)0x0,"Total:",'*','\0',lVar8,0);
  strcpy((char *)(puVar1 + 1),xprname::li);
  local_cc = local_cc + 1;
  display_menu((nh_menuitem *)dummy,local_cc,(char *)0x0,0,(int *)0x0);
LAB_001aa1da:
  free(dummy);
  return 0;
}

Assistant:

int dotypeinv(void)
{
	char c = '\0';
	int n, i = 0;
	int unpaid_count;
	boolean billx = *u.ushops && doinvbill(0);
	int pick_list[30];
	struct object_pick *dummy;
	const char *prompt = "What type of object do you want an inventory of?";

	if (!invent && !billx) {
	    pline("You aren't carrying anything.");
	    return 0;
	}
	unpaid_count = count_unpaid(invent);
	
	i = UNPAID_TYPES;
	if (billx)
	    i |= BILLED_TYPES;
	n = query_category(prompt, invent, i, pick_list, PICK_ONE);
	if (!n)
	    return 0;
	this_type = c = pick_list[0];
	
	if (c == 'x') {
	    if (billx)
		doinvbill(1);
	    else
		pline("No used-up objects on your shopping bill.");
	    return 0;
	}
	if (c == 'u') {
	    if (unpaid_count)
		dounpaid();
	    else
		pline("You are not carrying any unpaid objects.");
	    return 0;
	}

	check_tutorial_oclass(this_type);

	if (query_objlist(NULL, invent, USE_INVLET | INVORDER_SORT,
			  &dummy, PICK_INVACTION, this_type_only) > 0)
	    free(dummy);
	return 0;
}